

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSat.c
# Opt level: O1

Vec_Int_t * Abc_NtkGetCiSatVarNums(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Vec_Int_t *p;
  int *piVar2;
  Vec_Ptr_t *pVVar3;
  int iVar4;
  long lVar5;
  
  iVar1 = pNtk->vCis->nSize;
  p = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar4 = iVar1;
  }
  p->nSize = 0;
  p->nCap = iVar4;
  if (iVar4 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar4 << 2);
  }
  p->pArray = piVar2;
  pVVar3 = pNtk->vCis;
  if (0 < pVVar3->nSize) {
    lVar5 = 0;
    do {
      Vec_IntPush(p,*(int *)((long)pVVar3->pArray[lVar5] + 0x40));
      lVar5 = lVar5 + 1;
      pVVar3 = pNtk->vCis;
    } while (lVar5 < pVVar3->nSize);
  }
  return p;
}

Assistant:

Vec_Int_t * Abc_NtkGetCiSatVarNums( Abc_Ntk_t * pNtk )
{
    Vec_Int_t * vCiIds;
    Abc_Obj_t * pObj;
    int i;
    vCiIds = Vec_IntAlloc( Abc_NtkCiNum(pNtk) );
    Abc_NtkForEachCi( pNtk, pObj, i )
        Vec_IntPush( vCiIds, (int)(ABC_PTRINT_T)pObj->pCopy );
    return vCiIds;
}